

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

GLuint ShaderProgramCompile(string *src,GLenum type,string *error)

{
  GLuint GVar1;
  GLint length;
  GLint compile_status;
  GLchar *source;
  char info [8096];
  
  GVar1 = (*glad_glCreateShader)(type);
  source = (src->_M_dataplus)._M_p;
  (*glad_glShaderSource)(GVar1,1,&source,(GLint *)0x0);
  (*glad_glCompileShader)(GVar1);
  (*glad_glGetShaderiv)(GVar1,0x8b81,&compile_status);
  if (compile_status == 0) {
    length = 0;
    (*glad_glGetShaderiv)(GVar1,0x8b84,&length);
    (*glad_glGetShaderInfoLog)(GVar1,length,(GLsizei *)0x0,info);
    std::__cxx11::string::assign((char *)error);
    (*glad_glDeleteShader)(GVar1);
    GVar1 = 0;
  }
  return GVar1;
}

Assistant:

GLuint ShaderProgramCompile(const std::string src, GLenum type, std::string& error) {
    GLint compile_status;
    GLuint shader = glCreateShader(type);
    const GLchar* source = (const GLchar*) src.c_str();

    glShaderSource(shader, 1, &source, NULL);
    glCompileShader(shader);
    glGetShaderiv(shader, GL_COMPILE_STATUS, &compile_status);

    if (!compile_status) {
        GLint length = 0;
        glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &length);
        
        char info[8096];
        glGetShaderInfoLog(shader, length, NULL, info);
        
        error = info;

        glDeleteShader(shader);
        return 0;
    }

    return shader;
}